

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank_parser.cc
# Opt level: O3

void __thiscall rank::parser::Parser::P(Parser *this,int d)

{
  if ((this->_token_available != false) && ((this->_token)._type == TK_LBracket)) {
    advance(this);
    R(this,d + 1);
    if ((this->_token_available == true) && ((this->_token)._type == TK_RBracket)) {
      advance(this);
      return;
    }
  }
  this->_ok = false;
  return;
}

Assistant:

void Parser::P(int d) {

        if (!token_available()) { _ok=false; return; }

        if (_token.type() == TK_LBracket) { // E -> ident X

#ifdef LOG_PRODUCTIONS
            std::cerr << std::string(4*d,'.') << "P -> '[' R ']'" << std::endl;
#endif

            advance();

            R(d+1);

            if (!advance_if(TK_RBracket)) { _ok=false;  return; }

        }
        else {
            _ok = false;
        }
    }